

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  int *piVar1;
  ImVec4 *pIVar2;
  int iVar3;
  ImGuiColorMod *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImGuiContext_conflict1 *pIVar9;
  ImGuiColorMod *__dest;
  int iVar10;
  ImVec4 *pIVar11;
  int iVar12;
  ImGuiContext_conflict1 *ctx;
  
  pIVar9 = GImGui;
  pIVar11 = (GImGui->Style).Colors + idx;
  fVar5 = pIVar11->x;
  fVar6 = pIVar11->y;
  pIVar2 = (GImGui->Style).Colors + idx;
  fVar7 = pIVar2->z;
  fVar8 = pIVar2->w;
  iVar12 = (GImGui->ColorStack).Size;
  iVar3 = (GImGui->ColorStack).Capacity;
  if (iVar12 == iVar3) {
    iVar12 = iVar12 + 1;
    if (iVar3 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar3 / 2 + iVar3;
    }
    if (iVar12 < iVar10) {
      iVar12 = iVar10;
    }
    if (iVar3 < iVar12) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiColorMod *)(*GImAllocatorAllocFunc)((long)iVar12 * 0x14,GImAllocatorUserData);
      pIVar4 = (pIVar9->ColorStack).Data;
      if (pIVar4 != (ImGuiColorMod *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar9->ColorStack).Size * 0x14);
        pIVar4 = (pIVar9->ColorStack).Data;
        if ((pIVar4 != (ImGuiColorMod *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar9->ColorStack).Data = __dest;
      (pIVar9->ColorStack).Capacity = iVar12;
    }
  }
  pIVar4 = (pIVar9->ColorStack).Data;
  iVar12 = (pIVar9->ColorStack).Size;
  pIVar4[iVar12].Col = idx;
  pIVar2 = &pIVar4[iVar12].BackupValue;
  pIVar2->x = fVar5;
  pIVar2->y = fVar6;
  pIVar2->z = fVar7;
  pIVar2->w = fVar8;
  (pIVar9->ColorStack).Size = (pIVar9->ColorStack).Size + 1;
  fVar5 = col->y;
  fVar6 = col->z;
  fVar7 = col->w;
  pIVar11->x = col->x;
  pIVar11->y = fVar5;
  pIVar2 = (pIVar9->Style).Colors + idx;
  pIVar2->z = fVar6;
  pIVar2->w = fVar7;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = col;
}